

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O1

int CfdGetPsbtPubkeyList
              (void *handle,void *psbt_handle,int kind,uint32_t index,uint32_t *list_num,
              void **pubkey_list_handle)

{
  Psbt *this;
  pointer pKVar1;
  pointer pPVar2;
  undefined8 extraout_RAX;
  void *pvVar3;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *this_00;
  CfdException *pCVar4;
  Pubkey *pubkey;
  pointer __args;
  string empty_path;
  ByteData empty_fingerprint;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined4 local_bc;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_b8;
  int local_94;
  void *local_90;
  ByteData local_88;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_68;
  uint32_t *local_48;
  void **local_40;
  pointer local_38;
  
  local_94 = kind;
  local_90 = handle;
  local_48 = list_num;
  cfd::Initialize();
  local_e8._0_8_ = &local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"PsbtHandle","");
  cfd::capi::CheckBuffer(psbt_handle,(string *)local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._0_8_ != &local_d8) {
    operator_delete((void *)local_e8._0_8_);
  }
  if (pubkey_list_handle == (void **)0x0) {
    local_e8._0_8_ = "cfdcapi_psbt.cpp";
    local_e8._8_4_ = 0x6d4;
    local_d8._M_allocated_capacity = 0x5f5e5c;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_e8,kCfdLogLevelWarning,"pubkey_list_handle is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8._0_8_ = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"Failed to parameter. pubkey_list_handle is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_e8);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_48 == (uint32_t *)0x0) {
    local_e8._0_8_ = "cfdcapi_psbt.cpp";
    local_e8._8_4_ = 0x6da;
    local_d8._M_allocated_capacity = 0x5f5e5c;
    cfd::core::logger::log<>((CfdSourceLocation *)local_e8,kCfdLogLevelWarning,"list_num is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8._0_8_ = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"Failed to parameter. list_num is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_e8);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  this = *(Psbt **)((long)psbt_handle + 0x18);
  if (this == (Psbt *)0x0) {
    local_e8._0_8_ = "cfdcapi_psbt.cpp";
    local_e8._8_4_ = 0x6e0;
    local_d8._M_allocated_capacity = 0x5f5e5c;
    cfd::core::logger::log<>((CfdSourceLocation *)local_e8,kCfdLogLevelWarning,"psbt is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8._0_8_ = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"Failed to handle statement. psbt is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_e8);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_68.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  switch(local_94) {
  case 1:
    cfd::core::Psbt::GetTxInSignaturePubkeyList
              ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&local_88,this,index
              );
    local_d8._M_allocated_capacity =
         (size_type)
         local_68.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_e8._8_8_ =
         local_68.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_e8._0_8_ =
         local_68.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_68.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_68.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    local_68.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
              ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_e8);
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
              ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&local_88);
    goto LAB_0042966e;
  case 2:
    cfd::core::Psbt::GetTxInKeyDataList
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&local_88,this,
               index);
    break;
  case 3:
    cfd::core::Psbt::GetTxOutKeyDataList
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&local_88,this,
               index);
    break;
  case 4:
    cfd::core::Psbt::GetGlobalXpubkeyDataList
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&local_88,this);
    local_d8._M_allocated_capacity =
         (size_type)
         local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8._8_8_ =
         local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_e8._0_8_ =
         local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_e8);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&local_88);
    local_bc = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    goto LAB_00429676;
  default:
    local_e8._0_8_ = "cfdcapi_psbt.cpp";
    local_e8._8_4_ = 0x6f9;
    local_d8._M_allocated_capacity = 0x5f5e5c;
    cfd::core::logger::log<int&>
              ((CfdSourceLocation *)local_e8,kCfdLogLevelWarning,"kind is invalid: {}",&local_94);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8._0_8_ = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"Failed to parameter. kind is invalid.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_e8);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_d8._M_allocated_capacity =
       (size_type)
       local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_e8._8_8_ =
       local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_e8._0_8_ =
       local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_e8);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&local_88);
LAB_0042966e:
  local_bc = 0;
LAB_00429676:
  pKVar1 = local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_38 = local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_b8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    cfd::core::ByteData::ByteData(&local_88);
    local_e8._0_8_ = &local_d8;
    local_e8._8_8_ = (pointer)0x0;
    local_d8._M_allocated_capacity = local_d8._M_allocated_capacity & 0xffffffffffffff00;
    local_40 = pubkey_list_handle;
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::reserve
              (&local_b8,
               ((long)local_68.
                      super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_68.
                      super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    pPVar2 = local_68.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (local_68.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_68.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __args = (pointer)local_68.
                        super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                        _M_impl.super__Vector_impl_data._M_start;
      do {
        std::vector<cfd::core::KeyData,std::allocator<cfd::core::KeyData>>::
        emplace_back<cfd::core::Pubkey_const&,std::__cxx11::string&,cfd::core::ByteData&>
                  ((vector<cfd::core::KeyData,std::allocator<cfd::core::KeyData>> *)&local_b8,
                   &__args->pubkey_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   &local_88);
        __args = (pointer)&__args->privkey_;
      } while (__args != (pointer)pPVar2);
    }
    pubkey_list_handle = local_40;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._0_8_ != &local_d8) {
      operator_delete((void *)local_e8._0_8_);
    }
    if (local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  local_e8._0_8_ = &local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"PsbtPubkeyList","");
  pvVar3 = cfd::capi::AllocBuffer((string *)local_e8,0x20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._0_8_ != &local_d8) {
    operator_delete((void *)local_e8._0_8_);
  }
  this_00 = (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)operator_new(0x18);
  (this_00->super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> **)((long)pvVar3 + 0x18) =
       this_00;
  *(bool *)((long)pvVar3 + 0x10) = local_38 != pKVar1;
  *(char *)((long)pvVar3 + 0x11) = (char)local_bc;
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator=(this_00,&local_b8)
  ;
  *local_48 = (int)((ulong)((long)local_b8.
                                  super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_b8.
                                 super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) * 0x3cf3cf3d;
  *pubkey_list_handle = pvVar3;
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_b8);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&local_68);
  return 0;
}

Assistant:

int CfdGetPsbtPubkeyList(
    void* handle, void* psbt_handle, int kind, uint32_t index,
    uint32_t* list_num, void** pubkey_list_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiPsbtPubkeyListHandle* buffer = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (pubkey_list_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey_list_handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey_list_handle is null.");
    }
    if (list_num == nullptr) {
      warn(CFD_LOG_SOURCE, "list_num is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. list_num is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    std::vector<Pubkey> pk_list;
    std::vector<KeyData> key_list;
    bool has_bip32_list = true;
    bool has_xpub_list = false;
    switch (kind) {
      case kCfdPsbtRecordInputSignature:
        pk_list = psbt_obj->psbt->GetTxInSignaturePubkeyList(index);
        break;
      case kCfdPsbtRecordInputBip32:
        key_list = psbt_obj->psbt->GetTxInKeyDataList(index);
        break;
      case kCfdPsbtRecordOutputBip32:
        key_list = psbt_obj->psbt->GetTxOutKeyDataList(index);
        break;
      case kCfdPsbtRecordGloalXpub:
        key_list = psbt_obj->psbt->GetGlobalXpubkeyDataList();
        has_xpub_list = true;
        break;
      default:
        warn(CFD_LOG_SOURCE, "kind is invalid: {}", kind);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. kind is invalid.");
    }
    if (key_list.empty()) {
      has_bip32_list = false;
      ByteData empty_fingerprint;
      std::string empty_path;
      key_list.reserve(pk_list.size());
      for (const auto& pubkey : pk_list) {
        key_list.emplace_back(pubkey, empty_path, empty_fingerprint);
      }
    }

    buffer = static_cast<CfdCapiPsbtPubkeyListHandle*>(AllocBuffer(
        kPrefixPsbtPubkeyList, sizeof(CfdCapiPsbtPubkeyListHandle)));
    buffer->key_list = new std::vector<KeyData>();
    buffer->has_bip32_list = has_bip32_list;
    buffer->has_xpub_list = has_xpub_list;
    *(buffer->key_list) = key_list;
    *list_num = static_cast<uint32_t>(key_list.size());
    *pubkey_list_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  CfdFreePsbtPubkeyList(handle, buffer);
  return result;
}